

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * unicode_cpts_from_utf8(string *utf8)

{
  uint32_t uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_t *in_stack_00000010;
  string *in_stack_00000018;
  invalid_argument *anon_var_0;
  size_t offset;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  undefined4 in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x559e55);
  std::__cxx11::string::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
            );
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  while (pvVar3 = this,
        pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)std::__cxx11::string::size()
        , this < pvVar2) {
    uVar1 = unicode_cpt_from_utf8(in_stack_00000018,in_stack_00000010);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this,(value_type_conflict2 *)CONCAT44(uVar1,in_stack_ffffffffffffff98));
    this = pvVar3;
  }
  return in_RDI;
}

Assistant:

std::vector<uint32_t> unicode_cpts_from_utf8(const std::string & utf8) {
    std::vector<uint32_t> result;
    result.reserve(utf8.size());
    size_t offset = 0;
    while (offset < utf8.size()) {
        try {
            result.push_back(unicode_cpt_from_utf8(utf8, offset));
        }
        catch (const std::invalid_argument & /*ex*/) {
            // Silently ignore invalid UTF-8 input to avoid leaking the exception beyond llama_tokenize
            ++offset;
            result.emplace_back(0xFFFD); // replacement character
        }
    }
    return result;
}